

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

int __thiscall
CNet::GetWireInBBox(CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,CBBox *pBBox,
                   int iMode,int iValue)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppCVar4;
  CNet *pCVar5;
  CWire *pCStack_48;
  int iContinue;
  CWire *pWire;
  iterator end;
  iterator itr;
  int iNumWire;
  int iValue_local;
  int iMode_local;
  CBBox *pBBox_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *pWireList_local;
  CNet *this_local;
  
  itr._M_current._4_4_ = 0;
  end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
  pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                             *)&pWire);
    if (!bVar1) {
      return itr._M_current._4_4_;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
              operator*(&end);
    pCStack_48 = *ppCVar4;
    if (pCStack_48 == (CWire *)0x0) break;
    pCVar5 = CWire::GetParent(pCStack_48);
    if (pCVar5 == (CNet *)0x0) {
      __assert_fail("pWire->GetParent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x2e9,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
    }
    if (iMode == 0) {
      uVar2 = CObject::GetProp(&pCStack_48->super_CObject);
      bVar1 = (uVar2 & iValue) == 0;
    }
    else if (iMode == 1) {
      uVar2 = CObject::GetState(&pCStack_48->super_CObject);
      bVar1 = (uVar2 & iValue) == 0;
    }
    else {
      if (iMode != 0x8000) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,0x2f8,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
      }
      iVar3 = CWire::GetLength(pCStack_48);
      bVar1 = iVar3 < iValue;
    }
    if ((((!bVar1) && (iVar3 = CBBox::IsInside(pBBox,pCStack_48->m_pPointS), iVar3 != 0)) &&
        (iVar3 = CBBox::IsInside(pBBox,pCStack_48->m_pPointE), iVar3 != 0)) &&
       (itr._M_current._4_4_ = itr._M_current._4_4_ + 1,
       pWireList != (vector<CWire_*,_std::allocator<CWire_*>_> *)0x0)) {
      std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(pWireList,&stack0xffffffffffffffb8);
    }
    __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
    operator++(&end);
  }
  __assert_fail("pWire",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                ,0x2e8,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
}

Assistant:

int CNet::GetWireInBBox(vector<CWire*>* pWireList, CBBox* pBBox, int iMode, int iValue)
{
	int	iNumWire	=	0;
	for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		assert(pWire);
		assert(pWire->GetParent());

		int		iContinue	=	TRUE;

		switch(iMode){
		case GET_MODE_STATE:
			if(pWire->GetState()&iValue)	iContinue	=	FALSE;
			break;
		case GET_MODE_PROP:
			if(pWire->GetProp()&iValue)		iContinue	=	FALSE;
		    break;
		case GET_MODE_LENGTH:
			if(pWire->GetLength()>=iValue)	iContinue	=	FALSE;
			break;
		default:
			assert(FALSE);
		    break;
		}
		
		if(iContinue)	continue;

		if(pBBox->IsInside(pWire->m_pPointS)&&pBBox->IsInside(pWire->m_pPointE))
		{
			++iNumWire;
			if(pWireList)	pWireList->push_back(pWire);
		}
	}

	return	iNumWire;
}